

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::stack_type<std::__cxx11::string,std::allocator>::push<std::__cxx11::string_const&>
          (stack_type<std::__cxx11::string,std::allocator> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string *this_00;
  error *this_01;
  allocator local_31;
  string local_30;
  
  this_00 = *(string **)(this + 8);
  if ((long)this_00 - *(long *)this >> 5 != *(long *)(this + 0x20)) {
    *(string **)(this + 8) = this_00 + 0x20;
    std::__cxx11::string::string(this_00,(string *)args);
    return;
  }
  this_01 = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"E000I",&local_31);
  cov::error::error(this_01,&local_30);
  __cxa_throw(this_01,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void push(ArgsT &&...args)
		{
			if (full())
				throw cov::error("E000I");
			::new(m_current++) T(std::forward<ArgsT>(args)...);
		}